

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_setHighsDoubleOptionValue(void *highs,char *option,double value)

{
  HighsInt HVar1;
  string *alt_method_name;
  string *in_stack_ffffffffffffff88;
  Highs *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  
  alt_method_name = (string *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc8,"Highs_setHighsDoubleOptionValue",
             (allocator *)alt_method_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"Highs_setDoubleOptionValue",
             (allocator *)&stack0xffffffffffffff8f);
  Highs::deprecationMessage(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  HVar1 = Highs_setDoubleOptionValue
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  return HVar1;
}

Assistant:

HighsInt Highs_setHighsDoubleOptionValue(void* highs, const char* option,
                                         const double value) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_setHighsDoubleOptionValue",
                           "Highs_setDoubleOptionValue");
  return Highs_setDoubleOptionValue(highs, option, value);
}